

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sm_manager.cc
# Opt level: O0

RC __thiscall SM_Manager::DropIndex(SM_Manager *this,char *relName,char *attrName)

{
  RC RVar1;
  ostream *poVar2;
  bool local_b5;
  AttrCatEntry *local_80;
  AttrCatEntry *aEntry;
  RM_Record attrRec;
  RelCatEntry *local_50;
  RelCatEntry *rEntry;
  RM_Record relRec;
  RC rc;
  char *attrName_local;
  char *relName_local;
  SM_Manager *this_local;
  
  poVar2 = std::operator<<((ostream *)&std::cout,"DropIndex\n");
  poVar2 = std::operator<<(poVar2,"   relName =");
  poVar2 = std::operator<<(poVar2,relName);
  poVar2 = std::operator<<(poVar2,"\n");
  poVar2 = std::operator<<(poVar2,"   attrName=");
  poVar2 = std::operator<<(poVar2,attrName);
  std::operator<<(poVar2,"\n");
  relRec._20_4_ = 0;
  RM_Record::RM_Record((RM_Record *)&rEntry);
  relRec._20_4_ = GetRelEntry(this,relName,(RM_Record *)&rEntry,&local_50);
  if (relRec._20_4_ == 0) {
    RM_Record::RM_Record((RM_Record *)&aEntry);
    relRec._20_4_ = FindAttr(this,relName,attrName,(RM_Record *)&aEntry,&local_80);
    this_local._4_4_ = relRec._20_4_;
    if (relRec._20_4_ == 0) {
      if (local_80->indexNo == -1) {
        this_local._4_4_ = 0x133;
      }
      else {
        relRec._20_4_ = IX_Manager::DestroyIndex(this->ixm,relName,local_80->indexNo);
        this_local._4_4_ = relRec._20_4_;
        if (relRec._20_4_ == 0) {
          local_80->indexNo = -1;
          local_50->indexCount = local_50->indexCount + -1;
          relRec._20_4_ = RM_FileHandle::UpdateRec(&this->relcatFH,(RM_Record *)&rEntry);
          if ((relRec._20_4_ == 0) &&
             (relRec._20_4_ = RM_FileHandle::UpdateRec(&this->attrcatFH,(RM_Record *)&aEntry),
             relRec._20_4_ == 0)) {
            RVar1 = RM_FileHandle::ForcePages(&this->relcatFH,-1);
            local_b5 = true;
            if (RVar1 == 0) {
              RVar1 = RM_FileHandle::ForcePages(&this->attrcatFH,-1);
              local_b5 = RVar1 != 0;
            }
            relRec._20_4_ = ZEXT14(local_b5);
            this_local._4_4_ = relRec._20_4_;
            if (local_b5 == false) {
              this_local._4_4_ = 0;
            }
          }
          else {
            this_local._4_4_ = relRec._20_4_;
          }
        }
      }
    }
    attrRec.size = 1;
    RM_Record::~RM_Record((RM_Record *)&aEntry);
  }
  else {
    attrRec.size = 1;
    this_local._4_4_ = relRec._20_4_;
  }
  RM_Record::~RM_Record((RM_Record *)&rEntry);
  return this_local._4_4_;
}

Assistant:

RC SM_Manager::DropIndex(const char *relName,
                         const char *attrName)
{
  cout << "DropIndex\n"
    << "   relName =" << relName << "\n"
    << "   attrName=" << attrName << "\n";

  RC rc = 0;
  RM_Record relRec;
  RelCatEntry *rEntry;
  if((rc = GetRelEntry(relName, relRec, rEntry))) // retrieve relation
    return (rc);

  RM_Record attrRec; // Finds the appropriate attribute
  AttrCatEntry *aEntry;
  if((rc = FindAttr(relName, attrName, attrRec, aEntry))){
    return (rc);
  }

  if((aEntry->indexNo == NO_INDEXES)) // Check that there is actually an index
    return (SM_NOINDEX);
  
  // Destroys the index
  if((rc = ixm.DestroyIndex(relName, aEntry->indexNo)))
    return (rc);

  // Update entries in the relation and attribute records
  aEntry->indexNo = NO_INDEXES;
  rEntry->indexCount--;

  // write both catalog pages back
  if((rc = relcatFH.UpdateRec(relRec)) || (rc = attrcatFH.UpdateRec(attrRec)))
    return (rc);
  if((rc = relcatFH.ForcePages() || (rc = attrcatFH.ForcePages())))
    return (rc);

  return (0);
}